

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void av1_lowbd_inv_txfm2d_add_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  transform_1d_ssse3 p_Var1;
  transform_1d_ssse3 p_Var2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  int8_t *piVar9;
  int8_t *piVar10;
  int8_t *piVar11;
  int8_t *piVar12;
  int8_t *piVar13;
  long lVar14;
  undefined7 in_register_00000009;
  int iVar15;
  int iVar16;
  __m128i *palVar17;
  uint uVar18;
  __m128i *out;
  undefined7 in_register_00000081;
  __m128i *out_00;
  int i;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar29 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  __m128i buf [8];
  longlong local_1b8 [16];
  undefined1 local_138 [16];
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined1 local_118 [16];
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  longlong alStack_b8 [17];
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar25 [16];
  undefined1 auVar31 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar39 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar40 [16];
  undefined1 auVar47 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  piVar13 = av1_inv_txfm_shift_ls[0xe];
  piVar12 = av1_inv_txfm_shift_ls[0xd];
  piVar11 = av1_inv_txfm_shift_ls[6];
  piVar10 = av1_inv_txfm_shift_ls[5];
  piVar9 = av1_inv_txfm_shift_ls[0];
  iVar16 = (int)CONCAT71(in_register_00000009,tx_type);
  iVar15 = (int)CONCAT71(in_register_00000081,tx_size);
  switch(iVar15) {
  case 5:
    break;
  case 6:
    p_Var1 = lowbd_txfm_all_1d_w4_arr[1][""[tx_type]];
    bVar3 = true;
    iVar15 = 0;
    if (tx_type < 0x10) {
      iVar16 = 0x4110;
      uVar18 = (uint)tx_type;
      if ((0x4110U >> (uVar18 & 0x1f) & 1) == 0) {
        iVar16 = 0x80a0;
        if ((0x80a0U >> (uVar18 & 0x1f) & 1) == 0) {
          if (uVar18 != 6) goto LAB_0035d2a2;
          iVar15 = 1;
        }
        else {
          iVar15 = 0;
        }
        bVar3 = false;
      }
      else {
        iVar15 = 1;
      }
    }
LAB_0035d2a2:
    p_Var2 = lowbd_txfm_all_1d_w8_arr[0][""[tx_type]];
    load_buffer_32bit_to_16bit_w4(input,(int)buf,(__m128i *)0x8,iVar16);
    round_shift_ssse3(buf,buf,8);
    (*p_Var1)(buf,buf);
    if (bVar3) {
      palVar17 = buf;
    }
    else {
      palVar17 = (__m128i *)local_138;
      flip_buf_sse2(buf,palVar17,8);
    }
    transpose_16bit_4x8(palVar17,buf);
    palVar17 = buf;
    (*p_Var2)(palVar17,palVar17);
    round_shift_16bit_ssse3(palVar17,4,(int)piVar11[1]);
LAB_0035d34c:
    lowbd_write_buffer_8xn_sse2(palVar17,output,stride,iVar15,4);
    return;
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
code_r0x0035cd60:
    switch(tx_type) {
    case '\0':
      tx_type = '\0';
      break;
    default:
      break;
    case '\t':
      av1_lowbd_inv_txfm2d_add_idtx_ssse3(input,output,stride,tx_size);
      return;
    case '\n':
    case '\f':
    case '\x0e':
      av1_lowbd_inv_txfm2d_add_h_identity_ssse3(input,output,stride,tx_type,tx_size,eob);
      return;
    case '\v':
    case '\r':
    case '\x0f':
      av1_lowbd_inv_txfm2d_add_v_identity_ssse3(input,output,stride,tx_type,tx_size,eob);
      return;
    }
    lowbd_inv_txfm2d_add_no_identity_ssse3(input,output,stride,tx_type,tx_size,eob);
    return;
  case 0xd:
    bVar3 = true;
    iVar15 = 0;
    if (tx_type < 0x10) {
      uVar18 = (uint)tx_type;
      if ((0x4110U >> (uVar18 & 0x1f) & 1) == 0) {
        if ((0x80a0U >> (uVar18 & 0x1f) & 1) == 0) {
          if (uVar18 != 6) goto LAB_0035cf17;
          iVar15 = 1;
        }
        else {
          iVar15 = 0;
        }
        bVar3 = false;
      }
      else {
        iVar15 = 1;
      }
    }
LAB_0035cf17:
    p_Var1 = lowbd_txfm_all_1d_w8_arr[0][""[tx_type]];
    p_Var2 = lowbd_txfm_all_1d_w4_arr[2][""[tx_type]];
    palVar17 = buf;
    for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
      out_00 = buf + lVar19 * 8;
      load_buffer_32bit_to_16bit(input + lVar19 * 8,0x10,out_00,4);
      if (p_Var1 == iidentity4_ssse3) {
        for (lVar14 = 0; lVar14 != 0x40; lVar14 = lVar14 + 0x10) {
          auVar50 = *(undefined1 (*) [16])((long)*palVar17 + lVar14);
          auVar33._0_12_ = auVar50._0_12_;
          auVar33._12_2_ = auVar50._6_2_;
          auVar33._14_2_ = 1;
          auVar32._12_4_ = auVar33._12_4_;
          auVar32._0_10_ = auVar50._0_10_;
          auVar32._10_2_ = 1;
          auVar31._10_6_ = auVar32._10_6_;
          auVar31._0_8_ = auVar50._0_8_;
          auVar31._8_2_ = auVar50._4_2_;
          auVar30._8_8_ = auVar31._8_8_;
          auVar30._0_8_ = 0x1000000000000;
          auVar29._6_10_ = auVar30._6_10_;
          auVar29._4_2_ = auVar50._2_2_;
          auVar29._0_2_ = auVar50._0_2_;
          auVar29._2_2_ = 1;
          auVar20._2_2_ = 0;
          auVar20._0_2_ = auVar50._8_2_;
          auVar20._4_2_ = auVar50._10_2_;
          auVar20._6_2_ = 0;
          auVar20._8_2_ = auVar50._12_2_;
          auVar20._10_2_ = 0;
          auVar20._12_2_ = auVar50._14_2_;
          auVar20._14_2_ = 1;
          auVar50 = pmaddwd(auVar29,_DAT_004ba840);
          auVar34._0_4_ = auVar50._0_4_ >> 0xd;
          auVar34._4_4_ = auVar50._4_4_ >> 0xd;
          auVar34._8_4_ = auVar50._8_4_ >> 0xd;
          auVar34._12_4_ = auVar50._12_4_ >> 0xd;
          auVar50 = pmaddwd(auVar20,_DAT_004ba840);
          auVar21._0_4_ = auVar50._0_4_ >> 0xd;
          auVar21._4_4_ = auVar50._4_4_ >> 0xd;
          auVar21._8_4_ = auVar50._8_4_ >> 0xd;
          auVar21._12_4_ = auVar50._12_4_ >> 0xd;
          auVar50 = packssdw(auVar34,auVar21);
          *(undefined1 (*) [16])((long)*palVar17 + lVar14) = auVar50;
        }
      }
      else {
        (*p_Var1)(out_00,out_00);
        round_shift_16bit_ssse3(out_00,8,(int)*piVar12);
      }
      out = out_00;
      if (!bVar3) {
        out = (__m128i *)local_138;
        flip_buf_sse2(out_00,out,4);
      }
      transpose_16bit_8x4(out,out_00);
      palVar17 = palVar17 + 8;
    }
    (*p_Var2)(buf,buf);
    iVar16 = 0x10;
    round_shift_16bit_ssse3(buf,0x10,(int)piVar12[1]);
    goto LAB_0035d461;
  case 0xe:
    p_Var1 = lowbd_txfm_all_1d_w4_arr[2][""[tx_type]];
    bVar3 = true;
    iVar15 = 0;
    if (tx_type < 0x10) {
      uVar18 = (uint)tx_type;
      if ((0x4110U >> (uVar18 & 0x1f) & 1) == 0) {
        if ((0x80a0U >> (uVar18 & 0x1f) & 1) == 0) {
          if (uVar18 != 6) goto LAB_0035d11f;
          iVar15 = 1;
        }
        else {
          iVar15 = 0;
        }
        bVar3 = false;
      }
      else {
        iVar15 = 1;
      }
    }
LAB_0035d11f:
    p_Var2 = lowbd_txfm_all_1d_w8_arr[0][""[tx_type]];
    load_buffer_32bit_to_16bit_w4(input,(int)buf,(__m128i *)0x10,(uint)""[tx_type]);
    if (p_Var1 == iidentity16_ssse3) {
      for (lVar19 = 0; lVar19 != 0x100; lVar19 = lVar19 + 0x10) {
        auVar50 = *(undefined1 (*) [16])((long)buf[0] + lVar19);
        auVar49._0_12_ = auVar50._0_12_;
        auVar49._12_2_ = auVar50._6_2_;
        auVar49._14_2_ = 1;
        auVar48._12_4_ = auVar49._12_4_;
        auVar48._0_10_ = auVar50._0_10_;
        auVar48._10_2_ = 1;
        auVar47._10_6_ = auVar48._10_6_;
        auVar47._0_8_ = auVar50._0_8_;
        auVar47._8_2_ = auVar50._4_2_;
        auVar46._8_8_ = auVar47._8_8_;
        auVar46._0_8_ = 0x1000000000000;
        auVar45._6_10_ = auVar46._6_10_;
        auVar45._4_2_ = auVar50._2_2_;
        auVar45._0_2_ = auVar50._0_2_;
        auVar45._2_2_ = 1;
        auVar43._2_2_ = 0;
        auVar43._0_2_ = auVar50._8_2_;
        auVar43._4_2_ = auVar50._10_2_;
        auVar43._6_2_ = 0;
        auVar43._8_2_ = auVar50._12_2_;
        auVar43._10_2_ = 0;
        auVar43._12_2_ = auVar50._14_2_;
        auVar43._14_2_ = 1;
        auVar50 = pmaddwd(auVar45,_DAT_004ba830);
        auVar51._0_4_ = auVar50._0_4_ >> 0xd;
        auVar51._4_4_ = auVar50._4_4_ >> 0xd;
        auVar51._8_4_ = auVar50._8_4_ >> 0xd;
        auVar51._12_4_ = auVar50._12_4_ >> 0xd;
        auVar50 = pmaddwd(auVar43,_DAT_004ba830);
        auVar44._0_4_ = auVar50._0_4_ >> 0xd;
        auVar44._4_4_ = auVar50._4_4_ >> 0xd;
        auVar44._8_4_ = auVar50._8_4_ >> 0xd;
        auVar44._12_4_ = auVar50._12_4_ >> 0xd;
        auVar50 = packssdw(auVar51,auVar44);
        *(undefined1 (*) [16])((long)buf[0] + lVar19) = auVar50;
      }
    }
    else {
      (*p_Var1)(buf,buf);
      round_shift_16bit_ssse3(buf,0x10,(int)*piVar13);
    }
    if (bVar3) {
      transpose_16bit_4x8(buf,buf);
      palVar17 = (__m128i *)local_1b8;
    }
    else {
      flip_buf_sse2(buf,(__m128i *)local_138,0x10);
      transpose_16bit_4x8((__m128i *)local_138,buf);
      palVar17 = (__m128i *)alStack_b8;
    }
    transpose_16bit_4x8(palVar17,(__m128i *)local_1b8);
    for (lVar19 = 0; lVar19 != 0x100; lVar19 = lVar19 + 0x80) {
      palVar17 = (__m128i *)((long)buf[0] + lVar19);
      (*p_Var2)(palVar17,palVar17);
      round_shift_16bit_ssse3(palVar17,4,(int)piVar13[1]);
    }
    lowbd_write_buffer_8xn_sse2(buf,output,stride,iVar15,4);
    palVar17 = (__m128i *)local_1b8;
    output = output + 8;
    goto LAB_0035d34c;
  default:
    if (iVar15 != 0) goto code_r0x0035cd60;
    p_Var1 = lowbd_txfm_all_1d_w4_arr[0][""[tx_type]];
    bVar3 = true;
    iVar15 = 0;
    if (tx_type < 0x10) {
      iVar16 = 0x4110;
      uVar18 = (uint)tx_type;
      if ((0x4110U >> (uVar18 & 0x1f) & 1) == 0) {
        iVar16 = 0x80a0;
        if ((0x80a0U >> (uVar18 & 0x1f) & 1) == 0) {
          if (uVar18 != 6) goto LAB_0035d361;
          iVar15 = 1;
        }
        else {
          iVar15 = 0;
        }
        bVar3 = false;
      }
      else {
        iVar15 = 1;
      }
    }
LAB_0035d361:
    p_Var2 = lowbd_txfm_all_1d_w4_arr[0][""[tx_type]];
    load_buffer_32bit_to_16bit_w4(input,(int)buf,(__m128i *)&DAT_00000004,iVar16);
    buf[2]._0_12_ = buf[2]._2_12_;
    (*p_Var1)(buf,buf);
    if (bVar3) {
      auVar4._8_8_ = buf[0][1];
      auVar4._0_8_ = buf[0][0];
      auVar25._0_12_ = auVar4._0_12_;
      auVar25._12_2_ = (short)((ulong)buf[0][0] >> 0x30);
      auVar25._14_2_ = buf[1][0]._6_2_;
      auVar24._12_4_ = auVar25._12_4_;
      auVar24._0_10_ = auVar4._0_10_;
      auVar24._10_2_ = buf[1][0]._4_2_;
      auVar23._10_6_ = auVar24._10_6_;
      auVar23._8_2_ = (short)((ulong)buf[0][0] >> 0x20);
      auVar23._0_8_ = buf[0][0];
      auVar5._4_8_ = auVar23._8_8_;
      auVar5._2_2_ = buf[1][0]._2_2_;
      auVar5._0_2_ = (short)((ulong)buf[0][0] >> 0x10);
      auVar22._0_4_ = CONCAT22((undefined2)buf[1][0],(short)buf[0][0]);
      auVar22._4_12_ = auVar5;
      auVar37._12_2_ = buf[2][0]._6_2_;
      auVar37._0_12_ = buf[2]._0_12_;
      auVar37._14_2_ = buf[3][0]._6_2_;
      auVar36._12_4_ = auVar37._12_4_;
      auVar36._0_10_ = buf[2]._0_10_;
      auVar36._10_2_ = buf[3][0]._4_2_;
      auVar35._10_6_ = auVar36._10_6_;
      auVar35._0_8_ = buf[2][0];
      auVar35._8_2_ = buf[2][0]._4_2_;
      auVar6._4_8_ = auVar35._8_8_;
      auVar6._2_2_ = buf[3][0]._2_2_;
      auVar6._0_2_ = buf[2][0]._2_2_;
      auVar41._0_8_ = auVar22._0_8_;
      auVar41._8_4_ = auVar5._0_4_;
      auVar41._12_4_ = auVar6._0_4_;
      buf[1][0] = auVar41._8_8_;
      buf[0][0] = CONCAT44(CONCAT22((undefined2)buf[3][0],(short)buf[2][0]),auVar22._0_4_);
      buf[2][0]._4_4_ = auVar35._8_4_;
      buf[2][0]._0_4_ = auVar23._8_4_;
      buf[2][1]._0_4_ = auVar24._12_4_;
      buf[2][1]._4_4_ = auVar36._12_4_;
    }
    else {
      local_138._0_12_ = local_138._2_12_;
      local_118._0_12_ = local_118._2_12_;
      flip_buf_sse2(buf,(__m128i *)local_138,4);
      auVar50._12_2_ = local_138._6_2_;
      auVar50._0_12_ = local_138._0_12_;
      auVar50._14_2_ = uStack_122;
      auVar28._12_4_ = auVar50._12_4_;
      auVar28._0_10_ = local_138._0_10_;
      auVar28._10_2_ = uStack_124;
      auVar27._10_6_ = auVar28._10_6_;
      auVar27._0_8_ = local_138._0_8_;
      auVar27._8_2_ = local_138._4_2_;
      auVar7._4_8_ = auVar27._8_8_;
      auVar7._2_2_ = uStack_126;
      auVar7._0_2_ = local_138._2_2_;
      auVar26._0_4_ = CONCAT22(local_128,local_138._0_2_);
      auVar26._4_12_ = auVar7;
      auVar40._12_2_ = local_118._6_2_;
      auVar40._0_12_ = local_118._0_12_;
      auVar40._14_2_ = uStack_102;
      auVar39._12_4_ = auVar40._12_4_;
      auVar39._0_10_ = local_118._0_10_;
      auVar39._10_2_ = uStack_104;
      auVar38._10_6_ = auVar39._10_6_;
      auVar38._0_8_ = local_118._0_8_;
      auVar38._8_2_ = local_118._4_2_;
      auVar8._4_8_ = auVar38._8_8_;
      auVar8._2_2_ = uStack_106;
      auVar8._0_2_ = local_118._2_2_;
      auVar42._0_8_ = auVar26._0_8_;
      auVar42._8_4_ = auVar7._0_4_;
      auVar42._12_4_ = auVar8._0_4_;
      buf[1][0] = auVar42._8_8_;
      buf[0][0] = CONCAT44(CONCAT22(local_108,local_118._0_2_),auVar26._0_4_);
      buf[2][0]._4_4_ = auVar38._8_4_;
      buf[2][0]._0_4_ = auVar27._8_4_;
      buf[2][1]._0_4_ = auVar28._12_4_;
      buf[2][1]._4_4_ = auVar39._12_4_;
    }
    buf[3] = (__m128i)((undefined1  [16])buf[2] >> 0x40);
    buf[1][1] = 0;
    buf[0][1] = buf[1][0];
    (*p_Var2)(buf,buf);
    iVar16 = 4;
    round_shift_16bit_ssse3(buf,4,(int)piVar9[1]);
    goto LAB_0035d461;
  }
  p_Var1 = lowbd_txfm_all_1d_w8_arr[0][""[tx_type]];
  bVar3 = true;
  iVar15 = 0;
  if (tx_type < 0x10) {
    uVar18 = (uint)tx_type;
    if ((0x4110U >> (uVar18 & 0x1f) & 1) == 0) {
      if ((0x80a0U >> (uVar18 & 0x1f) & 1) == 0) {
        if (uVar18 != 6) goto LAB_0035d063;
        iVar15 = 1;
      }
      else {
        iVar15 = 0;
      }
      bVar3 = false;
    }
    else {
      iVar15 = 1;
    }
  }
LAB_0035d063:
  p_Var2 = lowbd_txfm_all_1d_w4_arr[1][""[tx_type]];
  load_buffer_32bit_to_16bit(input,8,buf,4);
  round_shift_ssse3(buf,buf,4);
  (*p_Var1)(buf,buf);
  if (bVar3) {
    palVar17 = buf;
  }
  else {
    palVar17 = (__m128i *)local_138;
    flip_buf_sse2(buf,palVar17,4);
  }
  transpose_16bit_8x4(palVar17,buf);
  (*p_Var2)(buf,buf);
  iVar16 = 8;
  round_shift_16bit_ssse3(buf,8,(int)piVar10[1]);
LAB_0035d461:
  lowbd_write_buffer_4xn_sse2(buf,output,stride,iVar15,iVar16);
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_ssse3(const int32_t *input, uint8_t *output,
                                    int stride, TX_TYPE tx_type,
                                    TX_SIZE tx_size, int eob) {
  switch (tx_size) {
    case TX_4X4:
      lowbd_inv_txfm2d_add_4x4_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
    case TX_4X8:
      lowbd_inv_txfm2d_add_4x8_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
    case TX_8X4:
      lowbd_inv_txfm2d_add_8x4_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
    case TX_4X16:
      lowbd_inv_txfm2d_add_4x16_ssse3(input, output, stride, tx_type, tx_size,
                                      eob);
      break;
    case TX_16X4:
      lowbd_inv_txfm2d_add_16x4_ssse3(input, output, stride, tx_type, tx_size,
                                      eob);
      break;
    default:
      lowbd_inv_txfm2d_add_universe_ssse3(input, output, stride, tx_type,
                                          tx_size, eob);
      break;
  }
}